

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_vertex.cxx
# Opt level: O1

void __thiscall Fl_Graphics_Driver::rotate(Fl_Graphics_Driver *this,double d)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  dVar5 = 0.0;
  if ((d != 0.0) || (NAN(d))) {
    if ((d != 90.0) || (NAN(d))) {
      if ((d != 180.0) || (NAN(d))) {
        dVar5 = 0.0;
        dVar6 = -1.0;
        if (((d != 270.0) || (NAN(d))) && ((d != -90.0 || (NAN(d))))) {
          dVar5 = (d * 3.141592653589793) / 180.0;
          dVar6 = sin(dVar5);
          dVar5 = cos(dVar5);
        }
      }
      else {
        dVar5 = -1.0;
        dVar6 = 0.0;
      }
    }
    else {
      dVar6 = 1.0;
    }
    dVar1 = (this->m).c;
    dVar2 = (this->m).a;
    dVar3 = (this->m).b;
    dVar4 = (this->m).d;
    (this->m).a = dVar5 * dVar2 - dVar1 * dVar6;
    (this->m).b = dVar5 * dVar3 - dVar4 * dVar6;
    (this->m).c = dVar6 * dVar2 + dVar5 * dVar1;
    (this->m).d = dVar6 * dVar3 + dVar5 * dVar4;
    (this->m).x = dVar2 * 0.0 + dVar1 * 0.0 + (this->m).x;
    (this->m).y = dVar3 * 0.0 + dVar4 * 0.0 + (this->m).y;
  }
  return;
}

Assistant:

void Fl_Graphics_Driver::rotate(double d) {
  if (d) {
    double s, c;
    if (d == 0) {s = 0; c = 1;}
    else if (d == 90) {s = 1; c = 0;}
    else if (d == 180) {s = 0; c = -1;}
    else if (d == 270 || d == -90) {s = -1; c = 0;}
    else {s = sin(d*M_PI/180); c = cos(d*M_PI/180);}
    mult_matrix(c,-s,s,c,0,0);
  }
}